

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

bool LockDataDirectory(bool probeOnly)

{
  bool bVar1;
  LockResult LVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char (*in_R8) [13];
  long in_FS_OFFSET;
  undefined1 auStack_d8 [32];
  bilingual_str local_b8;
  bilingual_str local_78;
  path local_38;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirNet((path *)&local_38,&gArgs);
  fs::path::path((path *)&local_78,".lock");
  LVar2 = util::LockDirectory((path *)&local_38,(path *)&local_78,probeOnly);
  std::filesystem::__cxx11::path::~path((path *)&local_78);
  if (LVar2 == Success) {
    bVar1 = true;
  }
  else {
    if (LVar2 == ErrorWrite) {
      _((bilingual_str *)(auStack_d8 + 0x20),(ConstevalStringLiteral)0xc965f6);
      std::filesystem::__cxx11::path::string((string *)auStack_d8,&local_38);
      tinyformat::format<std::__cxx11::string>
                (&local_78,(tinyformat *)(auStack_d8 + 0x20),(bilingual_str *)auStack_d8,in_RCX);
      bVar1 = InitError(&local_78);
    }
    else {
      if (LVar2 != ErrorLock) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
                      ,0x443,"bool LockDataDirectory(bool)");
      }
      _((bilingual_str *)(auStack_d8 + 0x20),(ConstevalStringLiteral)0xc9662e);
      std::filesystem::__cxx11::path::string((string *)auStack_d8,&local_38);
      tinyformat::format<std::__cxx11::string,char[13]>
                (&local_78,(tinyformat *)(auStack_d8 + 0x20),(bilingual_str *)auStack_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Bitcoin Core"
                 ,in_R8);
      bVar1 = InitError(&local_78);
    }
    bilingual_str::~bilingual_str(&local_78);
    std::__cxx11::string::~string((string *)auStack_d8);
    bilingual_str::~bilingual_str((bilingual_str *)(auStack_d8 + 0x20));
  }
  std::filesystem::__cxx11::path::~path(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool LockDataDirectory(bool probeOnly)
{
    // Make sure only a single Bitcoin process is using the data directory.
    const fs::path& datadir = gArgs.GetDataDirNet();
    switch (util::LockDirectory(datadir, ".lock", probeOnly)) {
    case util::LockResult::ErrorWrite:
        return InitError(strprintf(_("Cannot write to data directory '%s'; check permissions."), fs::PathToString(datadir)));
    case util::LockResult::ErrorLock:
        return InitError(strprintf(_("Cannot obtain a lock on data directory %s. %s is probably already running."), fs::PathToString(datadir), PACKAGE_NAME));
    case util::LockResult::Success: return true;
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}